

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O2

size_t __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher::operator()
          (IdHasher *this,uint32 id)

{
  pointer puVar1;
  long lVar2;
  size_t sVar3;
  
  puVar1 = (this->lexicon_->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = 1;
  for (lVar2 = (ulong)puVar1[id] << 2; (ulong)puVar1[id + 1] << 2 != lVar2; lVar2 = lVar2 + 4) {
    sVar3 = (sVar3 * -0x23c146b50754b36d >> 0x2d | sVar3 * -0x35a83aa59b680000) +
            (long)*(int *)((long)(this->lexicon_->values_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar2);
  }
  return sVar3;
}

Assistant:

size_t SequenceLexicon<T, Hasher, KeyEqual>::IdHasher::operator()(
    uint32 id) const {
  HashMix mix;
  for (const auto& value : lexicon_->sequence(id)) {
    mix.Mix(hasher_(value));
  }
  return mix.get();
}